

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_server.c
# Opt level: O2

void msocket_server_start_threads(msocket_server_t *self)

{
  pthread_create(&self->acceptThread,(pthread_attr_t *)0x0,acceptTask,self);
  if (self->pDestructor != (_func_void_void_ptr *)0x0) {
    pthread_create(&self->cleanupThread,(pthread_attr_t *)0x0,cleanupTask,self);
    return;
  }
  return;
}

Assistant:

static void msocket_server_start_threads(msocket_server_t *self) {
#ifdef _WIN32
   THREAD_CREATE(self->acceptThread,acceptTask,(void*) self,self->acceptThreadId);
#else
   THREAD_CREATE(self->acceptThread,acceptTask,(void*) self);
#endif
   //User can disable cleanup by explicitly calling msocket_server_disable_cleanup() before calling start. User then has to do cleanup manually.
   if (self->pDestructor != 0) {
#ifdef _WIN32
      THREAD_CREATE(self->cleanupThread, cleanupTask,(void*) self,self->cleanupThreadId);
#else
      THREAD_CREATE(self->cleanupThread, cleanupTask,(void*) self);
#endif
   }
}